

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error __thiscall video::dest_sign(video *this,context *ctx,token *token,opcode *op)

{
  undefined8 this_00;
  bool bVar1;
  unsigned_long uVar2;
  optional<unsigned_long> oVar3;
  int local_74;
  token local_70;
  string_view local_48;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> result;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = op;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,".");
  oVar3 = find_in_table(token,dest_sign::table,local_48);
  local_38._M_value =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
  if (bVar1) {
    context::tokenize(&local_70,ctx);
    memcpy(token,&local_70,0x24);
  }
  this_00 = result.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._8_8_;
  local_74 = 1;
  uVar2 = std::optional<unsigned_long>::value_or<int>
                    ((optional<unsigned_long> *)&local_38,&local_74);
  opcode::add_bits((opcode *)this_00,uVar2 << 0x36);
  memset(this,0,8);
  error::error((error *)this);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(src_format)
    {
        static const char* signed_table[] = {"S8", "", "S16", "S32", nullptr};
        static const char* unsigned_table[] = {"U8", "", "U16", "U32", nullptr};
        bool is_signed = true;
        std::optional<int64_t> result = find_in_table(token, signed_table, ".");
        if (!result) {
            is_signed = false;
            result = find_in_table(token, unsigned_table, ".");
            if (!result) {
                is_signed = true;
            }
        }
        if (result) {
            token = ctx.tokenize();
        }
        op.add_bits(result.value_or(3) << address); // .U32
        op.add_bits((is_signed ? 1ULL : 0ULL) << sign_address);
        return {};
    }